

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O2

base_learner * lda_setup(options_i *options,vw *all)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  option_group_definition *poVar4;
  typed_option<float> *ptVar5;
  typed_option<unsigned_long> *op;
  typed_option<int> *op_00;
  ostream *poVar6;
  size_t ring_size;
  parser *ppVar7;
  learner<lda,_example> *plVar8;
  long lVar9;
  uint32_t *puVar10;
  code *predict;
  undefined **ppuVar11;
  code *learn;
  label_parser *plVar12;
  _Head_base<0UL,_lda_*,_false> _Var13;
  size_t x;
  bool bVar14;
  byte bVar15;
  float fVar16;
  free_ptr<lda> ld;
  allocator local_7a4;
  allocator local_7a3;
  allocator local_7a2;
  allocator local_7a1;
  allocator local_7a0;
  allocator local_79f;
  allocator local_79e;
  allocator local_79d;
  allocator local_79c;
  allocator local_79b;
  allocator local_79a;
  allocator local_799;
  allocator local_798;
  allocator local_797;
  allocator local_796;
  allocator local_795;
  int math_mode;
  string local_790 [32];
  string local_770;
  string local_750 [32];
  string local_730;
  string local_710 [32];
  string local_6f0;
  string local_6d0 [32];
  string local_6b0;
  string local_690 [32];
  string local_670;
  string local_650 [32];
  string local_630;
  string local_610 [32];
  string local_5f0;
  string local_5d0 [32];
  string local_5b0;
  string local_590;
  option_group_definition new_options;
  undefined1 local_538 [112];
  bool local_4c8;
  undefined1 local_490 [160];
  typed_option<float> local_3f0;
  typed_option<int> local_350;
  typed_option<unsigned_long> local_2b0;
  typed_option<float> local_210;
  typed_option<float> local_170;
  typed_option<float> local_d0;
  
  bVar15 = 0;
  scoped_calloc_or_throw<lda>();
  std::__cxx11::string::string
            ((string *)&local_590,"Latent Dirichlet Allocation",(allocator *)local_538);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_590);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::string((string *)&local_5b0,"lda",&local_795);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_538,&local_5b0,
             &(ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>.
              _M_head_impl)->topics);
  local_4c8 = true;
  std::__cxx11::string::string(local_5d0,"Run lda with <int> topics",&local_796);
  std::__cxx11::string::_M_assign((string *)(local_538 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (&new_options,(typed_option<unsigned_long> *)local_538);
  std::__cxx11::string::string((string *)&local_5f0,"lda_alpha",&local_797);
  VW::config::typed_option<float>::typed_option
            (&local_3f0,&local_5f0,
             &(ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>.
              _M_head_impl)->lda_alpha);
  local_3f0.super_base_option.m_keep = true;
  ptVar5 = VW::config::typed_option<float>::default_value(&local_3f0,0.1);
  std::__cxx11::string::string
            (local_610,"Prior on sparsity of per-document topic weights",&local_798);
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar4,ptVar5)
  ;
  std::__cxx11::string::string((string *)&local_630,"lda_rho",&local_799);
  VW::config::typed_option<float>::typed_option
            (&local_d0,&local_630,
             &(ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>.
              _M_head_impl)->lda_rho);
  local_d0.super_base_option.m_keep = true;
  ptVar5 = VW::config::typed_option<float>::default_value(&local_d0,0.1);
  std::__cxx11::string::string(local_650,"Prior on sparsity of topic distributions",&local_79a);
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar4,ptVar5)
  ;
  std::__cxx11::string::string((string *)&local_670,"lda_D",&local_79b);
  VW::config::typed_option<float>::typed_option
            (&local_170,&local_670,
             &(ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>.
              _M_head_impl)->lda_D);
  ptVar5 = VW::config::typed_option<float>::default_value(&local_170,10000.0);
  std::__cxx11::string::string(local_690,"Number of documents",&local_79c);
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar4,ptVar5)
  ;
  std::__cxx11::string::string((string *)&local_6b0,"lda_epsilon",&local_79d);
  VW::config::typed_option<float>::typed_option
            (&local_210,&local_6b0,
             &(ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>.
              _M_head_impl)->lda_epsilon);
  ptVar5 = VW::config::typed_option<float>::default_value(&local_210,0.001);
  std::__cxx11::string::string(local_6d0,"Loop convergence threshold",&local_79e);
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar4,ptVar5)
  ;
  std::__cxx11::string::string((string *)&local_6f0,"minibatch",&local_79f);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_2b0,&local_6f0,
             &(ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>.
              _M_head_impl)->minibatch);
  op = VW::config::typed_option<unsigned_long>::default_value(&local_2b0,1);
  std::__cxx11::string::string(local_710,"Minibatch size, for LDA",&local_7a0);
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar4,op);
  std::__cxx11::string::string((string *)&local_730,"math-mode",&local_7a1);
  VW::config::typed_option<int>::typed_option(&local_350,&local_730,&math_mode);
  op_00 = VW::config::typed_option<int>::default_value(&local_350,0);
  std::__cxx11::string::string(local_750,"Math mode: simd, accuracy, fast-approx",&local_7a2);
  std::__cxx11::string::_M_assign((string *)&(op_00->super_base_option).m_help);
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<int>&>(poVar4,op_00);
  std::__cxx11::string::string((string *)&local_770,"metrics",&local_7a3);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_490,&local_770,
             &(ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>.
              _M_head_impl)->compute_coherence_metrics);
  std::__cxx11::string::string(local_790,"Compute metrics",&local_7a4);
  std::__cxx11::string::_M_assign((string *)(local_490 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (poVar4,(typed_option<bool> *)local_490);
  std::__cxx11::string::~string(local_790);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_490);
  std::__cxx11::string::~string((string *)&local_770);
  std::__cxx11::string::~string(local_750);
  VW::config::typed_option<int>::~typed_option(&local_350);
  std::__cxx11::string::~string((string *)&local_730);
  std::__cxx11::string::~string(local_710);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_2b0);
  std::__cxx11::string::~string((string *)&local_6f0);
  std::__cxx11::string::~string(local_6d0);
  VW::config::typed_option<float>::~typed_option(&local_210);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::__cxx11::string::~string(local_690);
  VW::config::typed_option<float>::~typed_option(&local_170);
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::~string(local_650);
  VW::config::typed_option<float>::~typed_option(&local_d0);
  std::__cxx11::string::~string((string *)&local_630);
  std::__cxx11::string::~string(local_610);
  VW::config::typed_option<float>::~typed_option(&local_3f0);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::__cxx11::string::~string(local_5d0);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_538);
  std::__cxx11::string::~string((string *)&local_5b0);
  (**options->_vptr_options_i)(options,&new_options);
  (ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>._M_head_impl)
  ->mmode = math_mode;
  std::__cxx11::string::string((string *)local_538,"lda",(allocator *)&local_3f0);
  iVar3 = (*options->_vptr_options_i[1])(options,local_538);
  std::__cxx11::string::~string((string *)local_538);
  if ((char)iVar3 == '\0') {
    plVar8 = (learner<lda,_example> *)0x0;
  }
  else {
    all->lda = (uint32_t)
               (ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>.
               _M_head_impl)->topics;
    all->delete_prediction = delete_scalars;
    local_538._0_8_ = (pointer)0x0;
    local_538._8_8_ = (pointer)0x0;
    local_538._16_8_ = (pointer)0x0;
    std::vector<index_feature,_std::allocator<index_feature>_>::_M_move_assign
              (&(ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
                 super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>
                ._M_head_impl)->sorted_features,
               (_Vector_base<index_feature,_std::allocator<index_feature>_> *)local_538);
    std::_Vector_base<index_feature,_std::allocator<index_feature>_>::~_Vector_base
              ((_Vector_base<index_feature,_std::allocator<index_feature>_> *)local_538);
    (ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>.
    _M_head_impl)->total_lambda_init = false;
    (ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>.
    _M_head_impl)->all = all;
    (ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>.
    _M_head_impl)->example_t = (double)all->initial_t;
    if ((ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>.
        _M_head_impl)->compute_coherence_metrics == true) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&(ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
                   super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.
                   super__Head_base<0UL,_lda_*,_false>._M_head_impl)->feature_counts,
                 1L << ((byte)all->num_bits & 0x3f) & 0xffffffff);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::resize(&(ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
                 super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>
                ._M_head_impl)->feature_to_example_map,
               1L << ((byte)all->num_bits & 0x3f) & 0xffffffff);
    }
    fVar16 = logf((float)(all->lda * 2 + 1));
    fVar16 = ceilf(fVar16 / 0.6931472);
    parameters::stride_shift
              (&all->weights,
               (uint)(long)fVar16 |
               (uint)(long)(fVar16 - 9.223372e+18) & (uint)((long)fVar16 >> 0x3f));
    all->random_weights = true;
    all->add_constant = false;
    if (1.0 < all->eta) {
      poVar6 = std::operator<<((ostream *)&std::cerr,
                               "your learning rate is too high, setting it to 1");
      std::endl<char,std::char_traits<char>>(poVar6);
      fVar16 = 1.0;
      if (all->eta <= 1.0) {
        fVar16 = all->eta;
      }
      all->eta = fVar16;
    }
    _Var13._M_head_impl =
         ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>.
         _M_head_impl;
    x = (ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>.
        _M_head_impl)->minibatch;
    ring_size = next_pow2(x);
    ppVar7 = all->p;
    if (ppVar7->ring_size < ring_size) {
      parser::~parser(ppVar7);
      operator_delete(ppVar7);
      ppVar7 = (parser *)operator_new(0x398);
      parser::parser(ppVar7,ring_size);
      all->p = ppVar7;
      x = (ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
           super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>.
          _M_head_impl)->minibatch;
      _Var13 = ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>;
    }
    v_array<float>::resize(&(_Var13._M_head_impl)->v,all->lda * x);
    local_538._0_8_ = local_538._0_8_ & 0xffffffff00000000;
    v_array<float>::push_back
              (&(ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
                 super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>
                ._M_head_impl)->decay_levels,(float *)local_538);
    ppuVar11 = &no_label::no_label_parser;
    plVar12 = &all->p->lp;
    for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
      plVar12->default_label = (_func_void_void_ptr *)*ppuVar11;
      ppuVar11 = ppuVar11 + (ulong)bVar15 * -2 + 1;
      plVar12 = (label_parser *)((long)plVar12 + (ulong)bVar15 * -0x10 + 8);
    }
    predict = ::predict;
    bVar14 = (ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>.
             _M_head_impl)->compute_coherence_metrics != false;
    if (bVar14) {
      predict = predict_with_metrics;
    }
    learn = ::learn;
    if (bVar14) {
      learn = learn_with_metrics;
    }
    puVar10 = &(all->weights).dense_weights._stride_shift;
    if ((all->weights).sparse != false) {
      puVar10 = &(all->weights).sparse_weights._stride_shift;
    }
    plVar8 = LEARNER::init_learner<lda,example,LEARNER::learner<char,example>>
                       (&ld,learn,predict,1L << ((byte)*puVar10 & 0x3f),scalars);
    *(code **)(plVar8 + 0x80) = save_load;
    uVar1 = *(undefined8 *)(plVar8 + 0x18);
    uVar2 = *(undefined8 *)(plVar8 + 0x20);
    *(undefined8 *)(plVar8 + 0x70) = uVar1;
    *(undefined8 *)(plVar8 + 0x78) = uVar2;
    *(undefined8 *)(plVar8 + 0x58) = uVar1;
    *(code **)(plVar8 + 0x68) = finish_example;
    *(undefined8 *)(plVar8 + 0xa0) = uVar1;
    *(undefined8 *)(plVar8 + 0xa8) = uVar2;
    *(code **)(plVar8 + 0xb0) = end_examples;
    *(undefined8 *)(plVar8 + 0x88) = uVar1;
    *(undefined8 *)(plVar8 + 0x90) = uVar2;
    *(code **)(plVar8 + 0x98) = end_pass;
    *(undefined8 *)(plVar8 + 0xb8) = uVar1;
    *(undefined8 *)(plVar8 + 0xc0) = uVar2;
    *(code **)(plVar8 + 200) = finish;
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::unique_ptr<lda,_void_(*)(void_*)>::~unique_ptr(&ld);
  return (base_learner *)plVar8;
}

Assistant:

LEARNER::base_learner *lda_setup(options_i &options, vw &all)
{
  auto ld = scoped_calloc_or_throw<lda>();
  option_group_definition new_options("Latent Dirichlet Allocation");
  int math_mode;
  new_options.add(make_option("lda", ld->topics).keep().help("Run lda with <int> topics"))
      .add(make_option("lda_alpha", ld->lda_alpha)
               .keep()
               .default_value(0.1f)
               .help("Prior on sparsity of per-document topic weights"))
      .add(make_option("lda_rho", ld->lda_rho)
               .keep()
               .default_value(0.1f)
               .help("Prior on sparsity of topic distributions"))
      .add(make_option("lda_D", ld->lda_D).default_value(10000.0f).help("Number of documents"))
      .add(make_option("lda_epsilon", ld->lda_epsilon).default_value(0.001f).help("Loop convergence threshold"))
      .add(make_option("minibatch", ld->minibatch).default_value(1).help("Minibatch size, for LDA"))
      .add(make_option("math-mode", math_mode).default_value(USE_SIMD).help("Math mode: simd, accuracy, fast-approx"))
      .add(make_option("metrics", ld->compute_coherence_metrics).help("Compute metrics"));
  options.add_and_parse(new_options);

  // Convert from int to corresponding enum value.
  ld->mmode = static_cast<lda_math_mode>(math_mode);

  if (!options.was_supplied("lda"))
    return nullptr;

  all.lda = (uint32_t)ld->topics;
  all.delete_prediction = delete_scalars;
  ld->sorted_features = std::vector<index_feature>();
  ld->total_lambda_init = 0;
  ld->all = &all;
  ld->example_t = all.initial_t;
  if (ld->compute_coherence_metrics)
  {
    ld->feature_counts.resize((uint32_t)(UINT64_ONE << all.num_bits));
    ld->feature_to_example_map.resize((uint32_t)(UINT64_ONE << all.num_bits));
  }

  float temp = ceilf(logf((float)(all.lda * 2 + 1)) / logf(2.f));

  all.weights.stride_shift((size_t)temp);
  all.random_weights = true;
  all.add_constant = false;

  if (all.eta > 1.)
  {
    std::cerr << "your learning rate is too high, setting it to 1" << std::endl;
    all.eta = min(all.eta, 1.f);
  }

  size_t minibatch2 = next_pow2(ld->minibatch);
  if(minibatch2 > all.p->ring_size)
  {
    delete all.p;
    all.p = new parser{minibatch2};
  }

  ld->v.resize(all.lda * ld->minibatch);

  ld->decay_levels.push_back(0.f);

  all.p->lp = no_label::no_label_parser;

  LEARNER::learner<lda, example> &l = init_learner(ld, ld->compute_coherence_metrics ? learn_with_metrics : learn,
      ld->compute_coherence_metrics ? predict_with_metrics : predict, UINT64_ONE << all.weights.stride_shift(),
      prediction_type::scalars);

  l.set_save_load(save_load);
  l.set_finish_example(finish_example);
  l.set_end_examples(end_examples);
  l.set_end_pass(end_pass);
  l.set_finish(finish);

  return make_base(l);
}